

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

void helicsFederatePublishJSON(HelicsFederate fed,char *json,HelicsError *err)

{
  shared_ptr<helics::ValueFederate> fedObj;
  allocator<char> local_49;
  ValueFederate *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  string local_38;
  
  if (json != (char *)0x0) {
    getValueFedSharedPtr(&local_48,(HelicsError *)fed);
    if (local_48 != (ValueFederate *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,json,&local_49);
      helics::ValueFederate::publishJSON(local_48,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  }
  return;
}

Assistant:

void helicsFederatePublishJSON(HelicsFederate fed, const char* json, HelicsError* err)
{
    if (json == nullptr) {  // this isn't an error just doesn't do anything
        return;
    }
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return;
    }
    try {
        fedObj->publishJSON(json);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}